

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultVideo.h
# Opt level: O0

void __thiscall TgBot::InlineQueryResultVideo::InlineQueryResultVideo(InlineQueryResultVideo *this)

{
  InlineQueryResultVideo *this_local;
  
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultVideo_0051b5b8;
  std::__cxx11::string::string((string *)&this->videoUrl);
  std::__cxx11::string::string((string *)&this->mimeType);
  std::__cxx11::string::string((string *)&this->thumbUrl);
  std::__cxx11::string::string((string *)&this->description);
  std::__cxx11::string::operator=
            ((string *)&(this->super_InlineQueryResult).type,(string *)&TYPE_abi_cxx11_);
  this->videoWidth = 0;
  this->videoHeight = 0;
  this->videoDuration = 0;
  return;
}

Assistant:

InlineQueryResultVideo() {
        this->type = TYPE;
        this->videoWidth = 0;
        this->videoHeight = 0;
        this->videoDuration = 0;
    }